

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O3

void __thiscall
Imf_2_5::ChannelList::channelsWithPrefix
          (ChannelList *this,char *prefix,Iterator *first,Iterator *last)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  char local_130 [255];
  undefined1 local_31;
  
  strncpy(local_130,prefix,0xff);
  local_31 = 0;
  p_Var4 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var5->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      uVar1 = strcmp((char *)(p_Var4 + 1),local_130);
      if (-1 < (int)uVar1) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[uVar1 >> 0x1f];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  (last->_i)._M_node = p_Var6;
  (first->_i)._M_node = p_Var6;
  sVar3 = strlen(prefix);
  p_Var4 = (last->_i)._M_node;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      iVar2 = strncmp((char *)(p_Var4 + 1),prefix,(long)(int)sVar3);
      if (0 < iVar2) {
        return;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      (last->_i)._M_node = p_Var4;
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return;
}

Assistant:

void		
ChannelList::channelsWithPrefix (const char prefix[],
				 Iterator &first,
				 Iterator &last)
{
    first = last = _map.lower_bound (prefix);
    size_t n = int(strlen (prefix));

    while (last != Iterator (_map.end()) &&
	   strncmp (last.name(), prefix, n) <= 0)
    {
	++last;
    }
}